

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_share_mode(torrent *this,bool s)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  size_type local_60;
  allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
  local_39;
  vector<download_priority_t,_file_index_t> local_38;
  size_type local_20;
  size_t num_files;
  torrent *ptStack_10;
  bool s_local;
  torrent *this_local;
  
  if (s != (bool)((byte)(*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d) & 1)) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xffffffffdfffffff |
         (ulong)s << 0x1d;
    num_files._6_1_ = ' ';
    num_files._7_1_ = s;
    ptStack_10 = this;
    set_need_save_resume(this,(resume_data_flags_t)0x20);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** set-share-mode: %d",(ulong)(num_files._7_1_ & 1));
    if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1d & 1) != 0) {
      bVar1 = valid_metadata(this);
      if (bVar1) {
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&(this->super_torrent_hot_members).m_torrent_file);
        iVar2 = torrent_info::num_files(this_00);
        local_60 = (size_type)iVar2;
      }
      else {
        local_60 = ::std::
                   vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ::size(&(this->m_file_priority).
                           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                         );
      }
      local_20 = local_60;
      ::std::
      allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
      ::allocator(&local_39);
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
      ::container_wrapper((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                           *)&local_38,local_60,(value_type *)&dont_download,&local_39);
      prioritize_files(this,&local_38);
      container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
      ::~container_wrapper(&local_38);
      ::std::
      allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
      ::~allocator(&local_39);
    }
  }
  return;
}

Assistant:

void torrent::set_share_mode(bool s)
	{
		if (s == m_share_mode) return;

		m_share_mode = s;
		set_need_save_resume(torrent_handle::if_config_changed);
#ifndef TORRENT_DISABLE_LOGGING
		debug_log("*** set-share-mode: %d", s);
#endif
		if (m_share_mode)
		{
			std::size_t const num_files = valid_metadata()
				? std::size_t(m_torrent_file->num_files())
				: m_file_priority.size();
			// in share mode, all pieces have their priorities initialized to
			// dont_download
			prioritize_files(aux::vector<download_priority_t, file_index_t>(num_files, dont_download));
		}
	}